

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizesToArray
          (FileDescriptorProto *this,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  char *data;
  undefined8 *puVar3;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  LogMessage *pLVar5;
  long lVar6;
  uint32 uVar7;
  uint8 *puVar8;
  FileOptions *this_04;
  SourceCodeInfo *this_05;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    psVar2 = this->name_;
    *target = '\n';
    uVar7 = (uint32)psVar2->_M_string_length;
    if (uVar7 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar8);
  }
  if ((this->_has_bits_[0] & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->package_->_M_dataplus)._M_p,(int)this->package_->_M_string_length,SERIALIZE);
    psVar2 = this->package_;
    *target = '\x12';
    uVar7 = (uint32)psVar2->_M_string_length;
    if (uVar7 < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar8);
  }
  if (0 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      data = *(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar6];
      if ((this->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar6) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_a1,pLVar5);
        internal::LogMessage::~LogMessage(&local_68);
      }
      internal::WireFormat::VerifyUTF8StringFallback
                (data,*(int *)((long)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar6]
                              + 8),SERIALIZE);
      if ((this->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar6) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar5 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_a1,pLVar5);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      puVar3 = (undefined8 *)(this->dependency_).super_RepeatedPtrFieldBase.elements_[lVar6];
      *target = '\x1a';
      uVar7 = (uint32)puVar3[1];
      if (uVar7 < 0x80) {
        target[1] = (uint8)puVar3[1];
        puVar8 = target + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar7,target + 1);
      }
      target = io::CodedOutputStream::WriteRawToArray((void *)*puVar3,*(int *)(puVar3 + 1),puVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      this_00 = (DescriptorProto *)(this->message_type_).super_RepeatedPtrFieldBase.elements_[lVar6]
      ;
      *target = '\"';
      uVar1 = this_00->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar8 = target + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = DescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      this_01 = (EnumDescriptorProto *)
                (this->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar6];
      *target = '*';
      uVar1 = this_01->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar8 = target + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = EnumDescriptorProto::SerializeWithCachedSizesToArray(this_01,puVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      this_02 = (ServiceDescriptorProto *)
                (this->service_).super_RepeatedPtrFieldBase.elements_[lVar6];
      *target = '2';
      uVar1 = this_02->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar8 = target + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = ServiceDescriptorProto::SerializeWithCachedSizesToArray(this_02,puVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (this->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar6 = 0;
    do {
      this_03 = (FieldDescriptorProto *)
                (this->extension_).super_RepeatedPtrFieldBase.elements_[lVar6];
      *target = ':';
      uVar1 = this_03->_cached_size_;
      if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        puVar8 = target + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      target = FieldDescriptorProto::SerializeWithCachedSizesToArray(this_03,puVar8);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((this->_has_bits_[0] & 0x200) != 0) {
    this_04 = this->options_;
    if (this_04 == (FileOptions *)0x0) {
      this_04 = *(FileOptions **)(default_instance_ + 0xb8);
    }
    *target = 'B';
    uVar1 = this_04->_cached_size_;
    if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
    target = FileOptions::SerializeWithCachedSizesToArray(this_04,puVar8);
  }
  if ((this->_has_bits_[0] & 0x400) != 0) {
    this_05 = this->source_code_info_;
    if (this_05 == (SourceCodeInfo *)0x0) {
      this_05 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
    }
    *target = 'J';
    uVar1 = this_05->_cached_size_;
    if (uVar1 < 0x80) {
      target[1] = (uint8)uVar1;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
    }
    target = SourceCodeInfo::SerializeWithCachedSizesToArray(this_05,puVar8);
  }
  if (0 < (this->public_dependency_).current_size_) {
    lVar6 = 0;
    do {
      uVar1 = (this->public_dependency_).elements_[lVar6];
      *target = 'P';
      if ((long)(int)uVar1 < 0) {
        target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
      }
      else if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        target = target + 2;
      }
      else {
        target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->public_dependency_).current_size_);
  }
  if (0 < (this->weak_dependency_).current_size_) {
    lVar6 = 0;
    do {
      uVar1 = (this->weak_dependency_).elements_[lVar6];
      *target = 'X';
      if ((long)(int)uVar1 < 0) {
        target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar1,target + 1);
      }
      else if (uVar1 < 0x80) {
        target[1] = (uint8)uVar1;
        target = target + 2;
      }
      else {
        target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar1,target + 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->weak_dependency_).current_size_);
  }
  pvVar4 = (this->_unknown_fields_).fields_;
  if ((pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    target = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* FileDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string package = 2;
  if (has_package()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0; i < this->dependency_size(); i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->dependency(i), target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (int i = 0; i < this->message_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        4, this->message_type(i), target);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (int i = 0; i < this->enum_type_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        5, this->enum_type(i), target);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (int i = 0; i < this->service_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        6, this->service(i), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (int i = 0; i < this->extension_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        7, this->extension(i), target);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        8, this->options(), target);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (has_source_code_info()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        9, this->source_code_info(), target);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0; i < this->public_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(10, this->public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0; i < this->weak_dependency_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteInt32ToArray(11, this->weak_dependency(i), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}